

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::DoPreConfigureChecks(cmake *this)

{
  cmState *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  allocator local_2d1;
  string local_2d0 [8];
  string message;
  undefined1 local_2a8 [8];
  string currentStart;
  string local_280;
  undefined1 local_260 [8];
  string cacheStart;
  string local_238;
  int local_214;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  ostringstream err;
  allocator local_39;
  string local_38 [8];
  string srcList;
  cmake *this_local;
  
  srcList.field_2._8_8_ = this;
  pcVar3 = GetHomeDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar3,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,"/CMakeLists.txt");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileExists(pcVar3);
  if (bVar2) {
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_238,"CMAKE_HOME_DIRECTORY",
               (allocator *)(cacheStart.field_2._M_local_buf + 0xf));
    pcVar3 = cmState::GetInitializedCacheValue(pcVar1,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)(cacheStart.field_2._M_local_buf + 0xf));
    if (pcVar3 == (char *)0x0) {
      this_local._4_4_ = 0;
      local_214 = 1;
    }
    else {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_280,"CMAKE_HOME_DIRECTORY",
                 (allocator *)(currentStart.field_2._M_local_buf + 0xf));
      pcVar3 = cmState::GetInitializedCacheValue(pcVar1,&local_280);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_260,pcVar3,(allocator *)(currentStart.field_2._M_local_buf + 0xe));
      std::allocator<char>::~allocator((allocator<char> *)(currentStart.field_2._M_local_buf + 0xe))
      ;
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator((allocator<char> *)(currentStart.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::operator+=((string *)local_260,"/CMakeLists.txt");
      pcVar3 = GetHomeDirectory(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_2a8,pcVar3,(allocator *)(message.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
      std::__cxx11::string::operator+=((string *)local_2a8,"/CMakeLists.txt");
      bVar2 = cmsys::SystemTools::SameFile((string *)local_260,(string *)local_2a8);
      if (bVar2) {
        local_214 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"The source \"",&local_2d1);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        std::__cxx11::string::operator+=(local_2d0,(string *)local_2a8);
        std::__cxx11::string::operator+=(local_2d0,"\" does not match the source \"");
        std::__cxx11::string::operator+=(local_2d0,(string *)local_260);
        std::__cxx11::string::operator+=(local_2d0,"\" used to generate cache.  ");
        std::__cxx11::string::operator+=
                  (local_2d0,"Re-run cmake with a different source directory.");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
        this_local._4_4_ = -2;
        local_214 = 1;
        std::__cxx11::string::~string(local_2d0);
      }
      std::__cxx11::string::~string((string *)local_2a8);
      std::__cxx11::string::~string((string *)local_260);
      if (local_214 == 0) {
        this_local._4_4_ = 1;
        local_214 = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    pcVar3 = GetHomeDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,pcVar3,&local_1e9);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)local_1c8,"The source directory \"");
      pcVar3 = GetHomeDirectory(this);
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::operator<<(poVar4,"\" does not appear to contain CMakeLists.txt.\n");
    }
    else {
      pcVar3 = GetHomeDirectory(this);
      bVar2 = cmsys::SystemTools::FileExists(pcVar3);
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)local_1c8,"The source directory \"");
        pcVar3 = GetHomeDirectory(this);
        poVar4 = std::operator<<(poVar4,pcVar3);
        std::operator<<(poVar4,"\" is a file, not a directory.\n");
      }
      else {
        poVar4 = std::operator<<((ostream *)local_1c8,"The source directory \"");
        pcVar3 = GetHomeDirectory(this);
        poVar4 = std::operator<<(poVar4,pcVar3);
        std::operator<<(poVar4,"\" does not exist.\n");
      }
    }
    std::operator<<((ostream *)local_1c8,
                    "Specify --help for usage, or press the help button on the CMake GUI.");
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_210);
    this_local._4_4_ = -2;
    local_214 = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  }
  std::__cxx11::string::~string(local_38);
  return this_local._4_4_;
}

Assistant:

int cmake::DoPreConfigureChecks()
{
  // Make sure the Source directory contains a CMakeLists.txt file.
  std::string srcList = this->GetHomeDirectory();
  srcList += "/CMakeLists.txt";
  if(!cmSystemTools::FileExists(srcList.c_str()))
    {
    std::ostringstream err;
    if(cmSystemTools::FileIsDirectory(this->GetHomeDirectory()))
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not appear to contain CMakeLists.txt.\n";
      }
    else if(cmSystemTools::FileExists(this->GetHomeDirectory()))
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" is a file, not a directory.\n";
      }
    else
      {
      err << "The source directory \"" << this->GetHomeDirectory()
          << "\" does not exist.\n";
      }
    err << "Specify --help for usage, or press the help button on the CMake "
      "GUI.";
    cmSystemTools::Error(err.str().c_str());
    return -2;
    }

  // do a sanity check on some values
  if(this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY"))
    {
    std::string cacheStart =
      this->State->GetInitializedCacheValue("CMAKE_HOME_DIRECTORY");
    cacheStart += "/CMakeLists.txt";
    std::string currentStart = this->GetHomeDirectory();
    currentStart += "/CMakeLists.txt";
    if(!cmSystemTools::SameFile(cacheStart, currentStart))
      {
      std::string message = "The source \"";
      message += currentStart;
      message += "\" does not match the source \"";
      message += cacheStart;
      message += "\" used to generate cache.  ";
      message += "Re-run cmake with a different source directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
      }
    }
  else
    {
    return 0;
    }
  return 1;
}